

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void __thiscall
ImPlot::ShadedRenderer<ImPlot::GetterYs<int>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>::
ShadedRenderer(ShadedRenderer<ImPlot::GetterYs<int>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>
               *this,GetterYs<int> *getter1,GetterYRef *getter2,TransformerLogLog *transformer,
              ImU32 col)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ImVec2 IVar4;
  int iVar5;
  ImPlotPlot *pIVar6;
  GetterYRef *pGVar7;
  TransformerLogLog *pTVar8;
  ImVec2 IVar9;
  ImVec2 IVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  ImPlotContext *pIVar14;
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  this->Getter1 = getter1;
  this->Getter2 = getter2;
  this->Transformer = transformer;
  iVar5 = getter1->Count;
  iVar15 = getter2->Count;
  if (iVar5 < getter2->Count) {
    iVar15 = iVar5;
  }
  this->Prims = iVar15 + -1;
  this->Col = col;
  (this->P11).x = 0.0;
  (this->P11).y = 0.0;
  (this->P12).x = 0.0;
  pIVar14 = GImPlot;
  (this->P12).y = 0.0;
  iVar5 = *(int *)((long)getter1->Ys +
                  (long)((getter1->Offset % iVar5 + iVar5) % iVar5) * (long)getter1->Stride);
  dVar11 = log10((getter1->XScale * 0.0 + getter1->X0) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar6 = pIVar14->CurrentPlot;
  dVar1 = pIVar14->LogDenX;
  dVar2 = (pIVar6->XAxis).Range.Min;
  dVar3 = (pIVar6->XAxis).Range.Max;
  dVar12 = log10((double)iVar5 / pIVar6->YAxis[transformer->YAxis].Range.Min);
  iVar5 = transformer->YAxis;
  pIVar6 = pIVar14->CurrentPlot;
  auVar16._8_8_ = dVar12;
  auVar16._0_8_ = dVar11;
  auVar17._8_8_ = pIVar14->LogDenY[iVar5];
  auVar17._0_8_ = dVar1;
  auVar17 = divpd(auVar16,auVar17);
  dVar1 = pIVar6->YAxis[iVar5].Range.Min;
  IVar4 = pIVar14->PixelRange[iVar5].Min;
  IVar9.y = (float)(pIVar14->My[iVar5] *
                    (((double)(float)auVar17._8_8_ * (pIVar6->YAxis[iVar5].Range.Max - dVar1) +
                     dVar1) - dVar1) + (double)IVar4.y);
  IVar9.x = (float)(pIVar14->Mx *
                    (((double)(float)auVar17._0_8_ * (dVar3 - dVar2) + dVar2) -
                    (pIVar6->XAxis).Range.Min) + (double)IVar4.x);
  this->P11 = IVar9;
  pIVar14 = GImPlot;
  pGVar7 = this->Getter2;
  pTVar8 = this->Transformer;
  dVar1 = pGVar7->YRef;
  dVar12 = log10((pGVar7->XScale * 0.0 + pGVar7->X0) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar6 = pIVar14->CurrentPlot;
  dVar2 = pIVar14->LogDenX;
  dVar3 = (pIVar6->XAxis).Range.Min;
  dVar11 = (pIVar6->XAxis).Range.Max;
  dVar1 = log10(dVar1 / pIVar6->YAxis[pTVar8->YAxis].Range.Min);
  iVar5 = pTVar8->YAxis;
  pIVar6 = pIVar14->CurrentPlot;
  auVar18._8_8_ = dVar1;
  auVar18._0_8_ = dVar12;
  auVar13._8_8_ = pIVar14->LogDenY[iVar5];
  auVar13._0_8_ = dVar2;
  auVar17 = divpd(auVar18,auVar13);
  dVar1 = pIVar6->YAxis[iVar5].Range.Min;
  IVar4 = pIVar14->PixelRange[iVar5].Min;
  IVar10.y = (float)(pIVar14->My[iVar5] *
                     (((double)(float)auVar17._8_8_ * (pIVar6->YAxis[iVar5].Range.Max - dVar1) +
                      dVar1) - dVar1) + (double)IVar4.y);
  IVar10.x = (float)(pIVar14->Mx *
                     (((double)(float)auVar17._0_8_ * (dVar11 - dVar3) + dVar3) -
                     (pIVar6->XAxis).Range.Min) + (double)IVar4.x);
  this->P12 = IVar10;
  return;
}

Assistant:

ShadedRenderer(const TGetter1& getter1, const TGetter2& getter2, const TTransformer& transformer, ImU32 col) :
        Getter1(getter1),
        Getter2(getter2),
        Transformer(transformer),
        Prims(ImMin(Getter1.Count, Getter2.Count) - 1),
        Col(col)
    {
        P11 = Transformer(Getter1(0));
        P12 = Transformer(Getter2(0));
    }